

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilers.cc
# Opt level: O0

instruction_t __thiscall
tchecker::details::
rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
::operator_to_instruction
          (rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
           *this,unary_operator_t op)

{
  runtime_error *this_00;
  unary_operator_t op_local;
  rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
  *this_local;
  
  if (op == EXPR_OP_NEG) {
    this_local._4_4_ = VM_NEG;
  }
  else {
    if (op != EXPR_OP_LNOT) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"incomplete switch statement");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this_local._4_4_ = VM_LNOT;
  }
  return this_local._4_4_;
}

Assistant:

enum tchecker::instruction_t operator_to_instruction(enum tchecker::unary_operator_t op)
  {
    switch (op) {
    case tchecker::EXPR_OP_NEG:
      return tchecker::VM_NEG;
    case tchecker::EXPR_OP_LNOT:
      return tchecker::VM_LNOT;
    default:
      throw std::runtime_error("incomplete switch statement");
    }
  }